

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infomessages.cpp
# Opt level: O0

void __thiscall CInfoMessages::OnMessage(CInfoMessages *this,int MsgType,void *pRawMsg)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  IGraphics *pIVar4;
  CConfig *pCVar5;
  ITextRender *pIVar6;
  CSkin *pCVar7;
  IConsole *pIVar8;
  char *pcVar9;
  char *format;
  CInfoMsg *NewMsg;
  uint *in_RDX;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar10;
  float fVar11;
  vec4 vVar12;
  CNetMsg_Sv_RaceFinish *pMsg_1;
  int ColorVal;
  int p;
  CSkin *pDummy;
  int Skin;
  int KillerTeam;
  bool IsTeamplay;
  CNetMsg_Sv_KillMsg *pMsg;
  bool Race;
  float Height;
  float Width;
  CInfoMsg Finish;
  char aDiff [32];
  char aImprovement [64];
  char aLabel [64];
  char aTime [32];
  char aBuf [256];
  CInfoMsg Kill;
  int in_stack_fffffffffffff078;
  int in_stack_fffffffffffff07c;
  CInfoMsg *in_stack_fffffffffffff080;
  char *in_stack_fffffffffffff088;
  CGameClient *in_stack_fffffffffffff090;
  CSkins *in_stack_fffffffffffff098;
  CInfoMsg *in_stack_fffffffffffff0a0;
  char *pcVar13;
  int in_stack_fffffffffffff0a8;
  uint uVar14;
  int in_stack_fffffffffffff0ac;
  CInfoMsg *in_stack_fffffffffffff0b0;
  undefined8 in_stack_fffffffffffff0f8;
  char *in_stack_fffffffffffff100;
  undefined4 in_stack_fffffffffffff114;
  int local_e5c;
  undefined1 local_ad0 [72];
  undefined4 local_a88;
  undefined1 auStack_a68 [432];
  uint local_8b8;
  uint local_8b4;
  undefined1 local_8b0 [72];
  undefined4 local_868;
  undefined1 local_848 [72];
  undefined4 local_800;
  uint local_7e0;
  uint local_7dc;
  undefined1 local_7d8 [32];
  char local_7b8 [64];
  undefined1 local_778 [64];
  char local_738 [32];
  char local_718 [1040];
  uint local_308;
  undefined1 local_300 [72];
  undefined4 local_2b8;
  undefined1 auStack_298 [156];
  uint local_1fc;
  undefined1 local_1f8 [72];
  undefined4 local_1b0;
  int aiStack_190 [13];
  undefined8 uStack_15c;
  float afStack_150 [21];
  undefined4 local_fc;
  uint local_f4;
  uint local_f0;
  undefined4 local_ec;
  long local_8;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffff0f8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(*(long *)(in_RDI + 8) + 0xd24) & 1) == 0) {
    CComponent::Graphics((CComponent *)0x16a302);
    fVar11 = IGraphics::ScreenAspect((IGraphics *)in_stack_fffffffffffff080);
    pIVar4 = CComponent::Graphics((CComponent *)0x16a340);
    (*(pIVar4->super_IInterface)._vptr_IInterface[5])(0,0,fVar11 * 1200.0 * 1.5,0x44e10000);
    bVar10 = (*(uint *)(*(long *)(in_RDI + 8) + 0x1b15c) & 8) != 0;
    if (in_ESI == 5) {
      if (((!bVar10) || (*(long *)(*(long *)(in_RDI + 8) + 0xe10) == 0)) ||
         ((*(uint *)(*(long *)(*(long *)(in_RDI + 8) + 0xe10) + 8) & 1) == 0)) {
        CInfoMsg::CInfoMsg(in_stack_fffffffffffff0a0);
        local_308 = in_RDX[1];
        pCVar5 = CComponent::Config((CComponent *)0x16a422);
        if (pCVar5->m_ClShowsocial != 0) {
          local_2b8 = 0x42100000;
          pIVar6 = CComponent::TextRender((CComponent *)0x16a456);
          (*(pIVar6->super_IInterface)._vptr_IInterface[7])
                    (pIVar6,local_300,*(long *)(in_RDI + 8) + 0x4540 + (long)(int)local_308 * 0x5b0,
                     0xffffffff);
        }
        memcpy(auStack_298,(void *)(*(long *)(in_RDI + 8) + (long)(int)local_308 * 0x5b0 + 0x49f4),
               0x9c);
        iVar3 = (int)((ulong)in_stack_fffffffffffff088 >> 0x20);
        local_1fc = *in_RDX;
        if ((int)local_1fc < 0) {
          bVar1 = *(byte *)(*(long *)(in_RDI + 8) + 0x1b15c);
          iVar2 = CSkins::Find(in_stack_fffffffffffff098,(char *)in_stack_fffffffffffff090,
                               SUB81((ulong)in_stack_fffffffffffff088 >> 0x38,0));
          iVar3 = (int)((ulong)in_stack_fffffffffffff088 >> 0x20);
          if (iVar2 != -1) {
            pCVar7 = CSkins::Get((CSkins *)in_stack_fffffffffffff090,iVar3);
            for (local_e5c = 0; iVar3 = (int)((ulong)in_stack_fffffffffffff088 >> 0x20),
                local_e5c < 6; local_e5c = local_e5c + 1) {
              aiStack_190[local_e5c] = (pCVar7->m_apParts[local_e5c]->m_OrgTexture).m_Id;
              iVar3 = (int)((ulong)in_stack_fffffffffffff0a0 >> 0x20);
              if ((bVar1 & 1) == 0) {
                vVar12 = CSkins::GetColorV4((CSkins *)
                                            CONCAT44(in_stack_fffffffffffff0ac,
                                                     in_stack_fffffffffffff0a8),iVar3,
                                            SUB81((ulong)in_stack_fffffffffffff0a0 >> 0x18,0));
                (&uStack_15c)[(long)local_e5c * 2] = vVar12._0_8_;
                *(long *)(&stack0xfffffffffffffeac + (long)local_e5c * 0x10) = vVar12._8_8_;
              }
              else {
                CSkins::GetTeamColor
                          ((CSkins *)in_stack_fffffffffffff0b0,in_stack_fffffffffffff0ac,
                           in_stack_fffffffffffff0a8,iVar3,(int)in_stack_fffffffffffff0a0);
                vVar12 = CSkins::GetColorV4((CSkins *)
                                            CONCAT44(in_stack_fffffffffffff0ac,
                                                     in_stack_fffffffffffff0a8),
                                            (int)((ulong)in_stack_fffffffffffff0a0 >> 0x20),
                                            SUB81((ulong)in_stack_fffffffffffff0a0 >> 0x18,0));
                (&uStack_15c)[(long)local_e5c * 2] = vVar12._0_8_;
                *(long *)(&stack0xfffffffffffffeac + (long)local_e5c * 0x10) = vVar12._8_8_;
              }
              afStack_150[(long)local_e5c * 4] = afStack_150[(long)local_e5c * 4] * 0.5;
            }
            local_fc = 0x42800000;
          }
        }
        else {
          pCVar5 = CComponent::Config((CComponent *)0x16a530);
          if (pCVar5->m_ClShowsocial != 0) {
            local_1b0 = 0x42100000;
            pIVar6 = CComponent::TextRender((CComponent *)0x16a560);
            (*(pIVar6->super_IInterface)._vptr_IInterface[7])
                      (pIVar6,local_1f8,
                       *(long *)(in_RDI + 8) + 0x4540 + (long)(int)local_1fc * 0x5b0,0xffffffff);
          }
          memcpy(aiStack_190,(void *)(*(long *)(in_RDI + 8) + (long)(int)local_1fc * 0x5b0 + 0x49f4)
                 ,0x9c);
        }
        local_f4 = in_RDX[2];
        local_f0 = in_RDX[3];
        if (*(long *)(*(long *)(in_RDI + 8) + 0xe08) == 0) {
          local_ec = 0xffffffff;
        }
        else {
          local_ec = *(undefined4 *)(*(long *)(*(long *)(in_RDI + 8) + 0xe08) + 4);
        }
        CInfoMsg::CInfoMsg(in_stack_fffffffffffff0b0,
                           (CInfoMsg *)CONCAT44(in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8)
                          );
        AddInfoMsg((CInfoMessages *)in_stack_fffffffffffff090,iVar3,in_stack_fffffffffffff080);
        CInfoMsg::~CInfoMsg(in_stack_fffffffffffff080);
        CInfoMsg::~CInfoMsg(in_stack_fffffffffffff080);
      }
    }
    else if ((in_ESI == 0x23) && (bVar10)) {
      pcVar13 = local_738;
      uVar14 = in_RDX[1];
      CGameClient::RacePrecision(*(CGameClient **)(in_RDI + 8));
      FormatTime((char *)in_stack_fffffffffffff080,in_stack_fffffffffffff07c,
                 in_stack_fffffffffffff078,0);
      CGameClient::GetPlayerLabel
                (in_stack_fffffffffffff090,in_stack_fffffffffffff088,
                 (int)((ulong)in_stack_fffffffffffff080 >> 0x20),(int)in_stack_fffffffffffff080,
                 (char *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078));
      iVar2 = (int)((ulong)in_stack_fffffffffffff080 >> 0x20);
      str_format(local_718,0x100,"%2d: %s: finished in %s",(ulong)*in_RDX,
                 *(long *)(in_RDI + 8) + 0x4540 + (long)(int)*in_RDX * 0x5b0,local_738);
      pIVar8 = CComponent::Console((CComponent *)0x16aadd);
      (*(pIVar8->super_IInterface)._vptr_IInterface[0x19])(pIVar8,0,"race",local_718);
      if ((in_RDX[3] != 0) || (in_RDX[4] != 0)) {
        if (in_RDX[4] == 0) {
          pcVar9 = local_718;
          format = Localize((char *)in_stack_fffffffffffff090,in_stack_fffffffffffff088);
          str_format(pcVar9,0x100,format,local_778,local_738);
          iVar3 = (int)((ulong)pcVar9 >> 0x20);
        }
        else {
          in_stack_fffffffffffff100 = local_718;
          pcVar9 = Localize((char *)in_stack_fffffffffffff090,in_stack_fffffffffffff088);
          str_format(in_stack_fffffffffffff100,0x100,pcVar9,local_778,local_738);
        }
        if ((int)in_RDX[2] < 0) {
          absolute<int>(in_RDX[2]);
          CGameClient::RacePrecision(*(CGameClient **)(in_RDI + 8));
          FormatTimeDiff((char *)in_stack_fffffffffffff0a0,
                         (int)((ulong)in_stack_fffffffffffff098 >> 0x20),
                         (int)in_stack_fffffffffffff098,
                         (int)((ulong)in_stack_fffffffffffff090 >> 0x20),
                         SUB81((ulong)in_stack_fffffffffffff090 >> 0x18,0));
          pcVar9 = Localize((char *)in_stack_fffffffffffff090,in_stack_fffffffffffff088);
          str_format(local_7b8,0x40,pcVar9,local_7d8);
          str_append((char *)in_stack_fffffffffffff090,in_stack_fffffffffffff088,iVar2);
        }
        CChat::AddLine((CChat *)CONCAT44(in_stack_fffffffffffff114,uVar14),pcVar13,
                       (int)((ulong)in_stack_fffffffffffff100 >> 0x20),
                       (int)in_stack_fffffffffffff100,iVar3);
      }
      if ((*(long *)(*(long *)(in_RDI + 8) + 0xe10) == 0) ||
         ((*(uint *)(*(long *)(*(long *)(in_RDI + 8) + 0xe10) + 8) & 2) == 0)) {
        CInfoMsg::CInfoMsg(in_stack_fffffffffffff0a0);
        memcpy(auStack_a68,(void *)(*(long *)(in_RDI + 8) + (long)(int)*in_RDX * 0x5b0 + 0x49f4),
               0x9c);
        local_868 = 0x42100000;
        if (in_RDX[4] == 0) {
          if (in_RDX[3] != 0) {
            pIVar6 = CComponent::TextRender((CComponent *)0x16ae60);
            (*(pIVar6->super_IInterface)._vptr_IInterface[4])(0x3e4ccccd,0x3f19999a,0x3f800000);
          }
        }
        else {
          pIVar6 = CComponent::TextRender((CComponent *)0x16adf9);
          (*(pIVar6->super_IInterface)._vptr_IInterface[4])(0x3f800000,0x3f000000,0);
        }
        pIVar6 = CComponent::TextRender((CComponent *)0x16aea3);
        (*(pIVar6->super_IInterface)._vptr_IInterface[7])(pIVar6,local_8b0,local_738,0xffffffff);
        pCVar5 = CComponent::Config((CComponent *)0x16aedc);
        if (pCVar5->m_ClShowsocial != 0) {
          local_a88 = 0x42100000;
          in_stack_fffffffffffff0b0 = (CInfoMsg *)CComponent::TextRender((CComponent *)0x16af06);
          (**(code **)(*(long *)in_stack_fffffffffffff0b0 + 0x38))
                    (in_stack_fffffffffffff0b0,local_ad0,
                     *(long *)(in_RDI + 8) + 0x4540 + (long)(int)*in_RDX * 0x5b0,0xffffffff);
        }
        pcVar13 = local_738;
        uVar14 = in_RDX[2];
        iVar3 = CGameClient::RacePrecision(*(CGameClient **)(in_RDI + 8));
        FormatTimeDiff(pcVar13,(int)((ulong)in_stack_fffffffffffff098 >> 0x20),
                       (int)in_stack_fffffffffffff098,
                       (int)((ulong)in_stack_fffffffffffff090 >> 0x20),
                       SUB81((ulong)in_stack_fffffffffffff090 >> 0x18,0));
        str_format(local_718,0x100,"(%s)",local_738);
        local_800 = 0x42100000;
        if ((int)in_RDX[2] < 0) {
          pIVar6 = CComponent::TextRender((CComponent *)0x16aff5);
          (*(pIVar6->super_IInterface)._vptr_IInterface[4])(0x3f000000,0x3f800000);
        }
        else {
          in_stack_fffffffffffff090 = (CGameClient *)CComponent::TextRender((CComponent *)0x16b031);
          (*(in_stack_fffffffffffff090->super_IGameClient).super_IInterface._vptr_IInterface[4])
                    (0x3f800000,0x3f000000);
        }
        pIVar6 = CComponent::TextRender((CComponent *)0x16b06d);
        (*(pIVar6->super_IInterface)._vptr_IInterface[7])(pIVar6,local_848,local_718,0xffffffff);
        iVar2 = (int)((ulong)pIVar6 >> 0x20);
        NewMsg = (CInfoMsg *)CComponent::TextRender((CComponent *)0x16b0a6);
        (**(code **)(*(long *)NewMsg + 0x20))(0x3f800000,0x3f800000,0x3f800000);
        local_8b8 = in_RDX[1];
        local_8b4 = in_RDX[2];
        local_7e0 = in_RDX[3];
        local_7dc = in_RDX[4];
        CInfoMsg::CInfoMsg(in_stack_fffffffffffff0b0,(CInfoMsg *)CONCAT44(iVar3,uVar14));
        AddInfoMsg((CInfoMessages *)in_stack_fffffffffffff090,iVar2,NewMsg);
        CInfoMsg::~CInfoMsg(NewMsg);
        CInfoMsg::~CInfoMsg(NewMsg);
      }
      else if ((in_RDX[3] == 0) && (in_RDX[4] == 0)) {
        pcVar9 = Localize((char *)in_stack_fffffffffffff090,in_stack_fffffffffffff088);
        str_format(local_718,0x100,pcVar9,local_778,local_738);
        CChat::AddLine((CChat *)CONCAT44(in_stack_fffffffffffff114,uVar14),pcVar13,
                       (int)((ulong)in_stack_fffffffffffff100 >> 0x20),
                       (int)in_stack_fffffffffffff100,iVar3);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CInfoMessages::OnMessage(int MsgType, void *pRawMsg)
{
	if(m_pClient->m_SuppressEvents)
		return;

	// hint TextRender to render text, deferred, with correct fontsize
	float Width = 400*3.0f*Graphics()->ScreenAspect();
	float Height = 400*3.0f;
	Graphics()->MapScreen(0, 0, Width*1.5f, Height*1.5f);

	bool Race = m_pClient->m_GameInfo.m_GameFlags&GAMEFLAG_RACE;

	if(MsgType == NETMSGTYPE_SV_KILLMSG)
	{
		if(Race && m_pClient->m_Snap.m_pGameDataRace && m_pClient->m_Snap.m_pGameDataRace->m_RaceFlags&RACEFLAG_HIDE_KILLMSG)
			return;

		CNetMsg_Sv_KillMsg *pMsg = (CNetMsg_Sv_KillMsg *)pRawMsg;

		// unpack messages
		CInfoMsg Kill;
		Kill.m_Player1ID = pMsg->m_Victim;
		if(Config()->m_ClShowsocial)
		{
			Kill.m_Player1NameCursor.m_FontSize = 36.0f;
			TextRender()->TextDeferred(&Kill.m_Player1NameCursor, m_pClient->m_aClients[Kill.m_Player1ID].m_aName, -1);
		}

		Kill.m_Player1RenderInfo = m_pClient->m_aClients[Kill.m_Player1ID].m_RenderInfo;

		Kill.m_Player2ID = pMsg->m_Killer;
		if(Kill.m_Player2ID >= 0)
		{
			if(Config()->m_ClShowsocial)
			{
				Kill.m_Player2NameCursor.m_FontSize = 36.0f;
				TextRender()->TextDeferred(&Kill.m_Player2NameCursor, m_pClient->m_aClients[Kill.m_Player2ID].m_aName, -1);
			}

			Kill.m_Player2RenderInfo = m_pClient->m_aClients[Kill.m_Player2ID].m_RenderInfo;
		}
		else
		{
			bool IsTeamplay = (m_pClient->m_GameInfo.m_GameFlags&GAMEFLAG_TEAMS) != 0;
			int KillerTeam = - 1 - Kill.m_Player2ID;
			int Skin = m_pClient->m_pSkins->Find("dummy", false);
			if(Skin != -1)
			{
				const CSkins::CSkin *pDummy = m_pClient->m_pSkins->Get(Skin);
				for(int p = 0; p < NUM_SKINPARTS; p++)
				{
					Kill.m_Player2RenderInfo.m_aTextures[p] = pDummy->m_apParts[p]->m_OrgTexture;
					if(IsTeamplay)
					{
						int ColorVal = m_pClient->m_pSkins->GetTeamColor(0, 0x000000, KillerTeam, p);
						Kill.m_Player2RenderInfo.m_aColors[p] = m_pClient->m_pSkins->GetColorV4(ColorVal, p==SKINPART_MARKING);
					}
					else
						Kill.m_Player2RenderInfo.m_aColors[p] = m_pClient->m_pSkins->GetColorV4(0x000000, p==SKINPART_MARKING);
					Kill.m_Player2RenderInfo.m_aColors[p].a *= .5f;
				}
				Kill.m_Player2RenderInfo.m_Size = 64.0f;
			}
		}

		Kill.m_Weapon = pMsg->m_Weapon;
		Kill.m_ModeSpecial = pMsg->m_ModeSpecial;
		Kill.m_FlagCarrierBlue = m_pClient->m_Snap.m_pGameDataFlag ? m_pClient->m_Snap.m_pGameDataFlag->m_FlagCarrierBlue : -1;

		AddInfoMsg(INFOMSG_KILL, Kill);
	}
	else if(MsgType == NETMSGTYPE_SV_RACEFINISH && Race)
	{
		CNetMsg_Sv_RaceFinish *pMsg = (CNetMsg_Sv_RaceFinish *)pRawMsg;

		char aBuf[256];
		char aTime[32];
		char aLabel[64];

		FormatTime(aTime, sizeof(aTime), pMsg->m_Time, m_pClient->RacePrecision());
		m_pClient->GetPlayerLabel(aLabel, sizeof(aLabel), pMsg->m_ClientID, m_pClient->m_aClients[pMsg->m_ClientID].m_aName);

		str_format(aBuf, sizeof(aBuf), "%2d: %s: finished in %s", pMsg->m_ClientID, m_pClient->m_aClients[pMsg->m_ClientID].m_aName, aTime);
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "race", aBuf);

		if(pMsg->m_RecordPersonal || pMsg->m_RecordServer)
		{
			if(pMsg->m_RecordServer)
				str_format(aBuf, sizeof(aBuf), Localize("'%s' has set a new map record: %s"), aLabel, aTime);
			else // m_RecordPersonal
				str_format(aBuf, sizeof(aBuf), Localize("'%s' has set a new personal record: %s"), aLabel, aTime);
			
			if(pMsg->m_Diff < 0)
			{
				char aImprovement[64];
				char aDiff[32];
				FormatTimeDiff(aDiff, sizeof(aDiff), absolute(pMsg->m_Diff), m_pClient->RacePrecision(), false);
				str_format(aImprovement, sizeof(aImprovement), Localize(" (%s seconds faster)"), aDiff);
				str_append(aBuf, aImprovement, sizeof(aBuf));
			}

			m_pClient->m_pChat->AddLine(aBuf);
		}

		if(m_pClient->m_Snap.m_pGameDataRace && m_pClient->m_Snap.m_pGameDataRace->m_RaceFlags&RACEFLAG_FINISHMSG_AS_CHAT)
		{
			if(!pMsg->m_RecordPersonal && !pMsg->m_RecordServer) // don't print the time twice
			{
				str_format(aBuf, sizeof(aBuf), Localize("'%s' finished in: %s"), aLabel, aTime);
				m_pClient->m_pChat->AddLine(aBuf);
			}
		}
		else
		{
			CInfoMsg Finish;
			Finish.m_Player1ID = pMsg->m_ClientID;
			Finish.m_Player1RenderInfo = m_pClient->m_aClients[Finish.m_Player1ID].m_RenderInfo;
			
			Finish.m_TimeCursor.m_FontSize = 36.0f;
			if(pMsg->m_RecordServer)
				TextRender()->TextColor(1.0f, 0.5f, 0.0f, 1.0f);
			else if(pMsg->m_RecordPersonal)
				TextRender()->TextColor(0.2f, 0.6f, 1.0f, 1.0f);
			TextRender()->TextDeferred(&Finish.m_TimeCursor, aTime, -1);

			if(Config()->m_ClShowsocial)
			{
				Finish.m_Player1NameCursor.m_FontSize = 36.0f;
				TextRender()->TextDeferred(&Finish.m_Player1NameCursor, m_pClient->m_aClients[pMsg->m_ClientID].m_aName, -1);
			}

			FormatTimeDiff(aTime, sizeof(aTime), pMsg->m_Diff, m_pClient->RacePrecision());
			str_format(aBuf, sizeof(aBuf), "(%s)", aTime);
			Finish.m_DiffCursor.m_FontSize = 36.0f;
			if(pMsg->m_Diff < 0)
				TextRender()->TextColor(0.5f, 1.0f, 0.5f, 1.0f);
			else
				TextRender()->TextColor(1.0f, 0.5f, 0.5f, 1.0f);
			TextRender()->TextDeferred(&Finish.m_DiffCursor, aBuf, -1);
			TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);

			Finish.m_Time = pMsg->m_Time;
			Finish.m_Diff = pMsg->m_Diff;
			Finish.m_RecordPersonal = pMsg->m_RecordPersonal;
			Finish.m_RecordServer = pMsg->m_RecordServer;

			AddInfoMsg(INFOMSG_FINISH, Finish);
		}
	}
}